

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_Outline::OutlineBoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_Outline *this)

{
  bool bVar1;
  ON_OutlineFigure *pOVar2;
  ON_BoundingBox local_80;
  uint local_4c;
  undefined1 local_48 [4];
  uint i;
  ON_BoundingBox bbox;
  uint figure_count;
  ON_Outline *this_local;
  
  if (this->m_bbox_status == '\0') {
    this->m_bbox_status = '\a';
    memcpy(&this->m_bbox,&ON_BoundingBox::NanBoundingBox,0x30);
    bbox.m_max.z._4_4_ = ON_ClassArray<ON_OutlineFigure>::UnsignedCount(&this->m_figures);
    if (bbox.m_max.z._4_4_ != 0) {
      pOVar2 = ON_ClassArray<ON_OutlineFigure>::operator[](&this->m_figures,0);
      ON_OutlineFigure::BoundingBox((ON_BoundingBox *)local_48,pOVar2);
      for (local_4c = 1; local_4c < bbox.m_max.z._4_4_; local_4c = local_4c + 1) {
        pOVar2 = ON_ClassArray<ON_OutlineFigure>::operator[](&this->m_figures,local_4c);
        ON_OutlineFigure::BoundingBox(&local_80,pOVar2);
        ON_BoundingBox::Union((ON_BoundingBox *)local_48,&local_80);
      }
      bVar1 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_48);
      if ((bVar1) && (bVar1 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)local_48), bVar1)) {
        memcpy(&this->m_bbox,local_48,0x30);
        this->m_bbox_status = '\x01';
      }
    }
  }
  memcpy(__return_storage_ptr__,&this->m_bbox,0x30);
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_Outline::OutlineBoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;
    m_bbox = ON_BoundingBox::NanBoundingBox;

    const unsigned int figure_count = m_figures.UnsignedCount();
    if (0 == figure_count)
      break;

    ON_BoundingBox bbox = m_figures[0].BoundingBox();
    for (unsigned int i = 1; i < figure_count; i++)
    {
      bbox.Union(m_figures[i].BoundingBox());
    }
    if (bbox.IsValid() && bbox.IsNotEmpty())
    {
      m_bbox = bbox;
      m_bbox_status = 1;
    }
    
    break;
  }

  return m_bbox;
}